

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

void __thiscall GenericModelItem::removeRows(GenericModelItem *this,int row,int count)

{
  bool bVar1;
  enable_if_t<std::is_integral_v<int>,_iterator> end;
  enable_if_t<std::is_integral_v<int>,_iterator> begin;
  GenericModelItem **ppGVar2;
  const_iterator local_78;
  GenericModelItem **local_70;
  const_iterator local_68;
  GenericModelItem **local_60;
  GenericModelItem **local_58;
  GenericModelItem **local_50;
  iterator local_48;
  iterator iEnd;
  enable_if_t<std::is_integral_v<int>,_iterator> i;
  enable_if_t<std::is_integral_v<int>,_iterator> startRemoveIter;
  enable_if_t<std::is_integral_v<int>,_iterator> endRemoveIter;
  int count_local;
  int row_local;
  GenericModelItem *this_local;
  
  if (0 < this->m_colCount) {
    startRemoveIter.i = (GenericModelItem **)QList<GenericModelItem_*>::begin(&this->children);
    end = QList<GenericModelItem*>::iterator::operator+
                    ((iterator *)&startRemoveIter,(row + count) * this->m_colCount);
    i.i = (GenericModelItem **)QList<GenericModelItem_*>::begin(&this->children);
    begin = QList<GenericModelItem*>::iterator::operator+((iterator *)&i,row * this->m_colCount);
    iEnd.i = end.i;
    local_48 = QList<GenericModelItem_*>::end(&this->children);
    while( true ) {
      local_50 = local_48.i;
      bVar1 = QList<GenericModelItem_*>::iterator::operator!=(&iEnd,local_48);
      if (!bVar1) break;
      ppGVar2 = QList<GenericModelItem_*>::iterator::operator*(&iEnd);
      (*ppGVar2)->m_row = (*ppGVar2)->m_row - count;
      QList<GenericModelItem_*>::iterator::operator++(&iEnd);
    }
    local_60 = end.i;
    local_58 = begin.i;
    qDeleteAll<QList<GenericModelItem*>::iterator>((iterator)begin.i,(iterator)end.i);
    local_70 = begin.i;
    QList<GenericModelItem_*>::const_iterator::const_iterator(&local_68,(iterator)begin.i);
    QList<GenericModelItem_*>::const_iterator::const_iterator(&local_78,(iterator)end.i);
    QList<GenericModelItem_*>::erase(&this->children,local_68,local_78);
  }
  this->m_rowCount = this->m_rowCount - count;
  return;
}

Assistant:

void GenericModelItem::removeRows(int row, int count)
{
    if (m_colCount > 0) {
        Q_ASSERT((row + count) * m_colCount <= children.size());
        const auto endRemoveIter = children.begin() + ((row + count) * m_colCount);
        const auto startRemoveIter = children.begin() + (row * m_colCount);
        for (auto i = endRemoveIter, iEnd = children.end(); i != iEnd; ++i)
            (*i)->m_row -= count;
        qDeleteAll(startRemoveIter, endRemoveIter);
        children.erase(startRemoveIter, endRemoveIter);
    }
    m_rowCount -= count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}